

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kparser.cc
# Opt level: O0

void InitCommandLine(int argc,char **argv,variables_map *conf)

{
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar1;
  char *pcVar2;
  typed_value<float,_char> *ptVar3;
  typed_value<unsigned_int,_char> *ptVar4;
  char **argv_00;
  typed_value<unsigned_int,_char> *ptVar5;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *ext;
  size_type sVar6;
  void *this;
  options_description *this_00;
  variables_map *in_RDX;
  options_description dcmdline_options;
  options_description opts;
  key_type *in_stack_fffffffffffffc38;
  key_type *__x;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *in_stack_fffffffffffffc40;
  uint *in_stack_fffffffffffffc58;
  allocator *paVar7;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  int style;
  int argc_00;
  undefined1 local_211 [40];
  allocator local_1e9;
  string local_1e8 [32];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  basic_parsed_options local_1a0 [40];
  options_description local_178 [128];
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined8 local_d8 [3];
  allocator local_b9;
  string local_b8 [32];
  options_description local_98 [128];
  variables_map *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"Configuration options",&local_b9);
  boost::program_options::options_description::options_description
            (local_98,local_b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options();
  ptVar1 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d8,(value_semantic *)"training_data,T",(char *)ptVar1);
  ptVar1 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"dev_data,d",(char *)ptVar1);
  ptVar1 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"bracketing_dev_data,C",(char *)ptVar1);
  ptVar1 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"test_data,p",(char *)ptVar1);
  ptVar3 = boost::program_options::value<float>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"dropout,D",(char *)ptVar3);
  ptVar4 = boost::program_options::value<unsigned_int>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"samples,s",(char *)ptVar4);
  ptVar3 = boost::program_options::value<float>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"alpha,a",(char *)ptVar3);
  ptVar1 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"model,m",(char *)ptVar1);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"use_pos_tags,P");
  boost::program_options::value<unsigned_int>();
  local_dc = 2;
  ptVar4 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                      in_stack_fffffffffffffc58);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)0x74792f,(char *)ptVar4);
  boost::program_options::value<unsigned_int>();
  local_e0 = 0x10;
  ptVar4 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                      in_stack_fffffffffffffc58);
  argv_00 = (char **)boost::program_options::options_description_easy_init::operator()
                               (pcVar2,(value_semantic *)"action_dim",(char *)ptVar4);
  argc_00 = (int)((ulong)ptVar4 >> 0x20);
  ptVar4 = boost::program_options::value<unsigned_int>();
  local_e4 = 0xc;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                      in_stack_fffffffffffffc58);
  ext = (function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         *)boost::program_options::options_description_easy_init::operator()
                     ((char *)argv_00,(value_semantic *)"pos_dim",(char *)ptVar5);
  style = (int)((ulong)ptVar5 >> 0x20);
  boost::program_options::value<unsigned_int>();
  local_e8 = 0x20;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                      in_stack_fffffffffffffc58);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)ext,(value_semantic *)0x6d6310,(char *)ptVar5);
  boost::program_options::value<unsigned_int>();
  local_ec = 0x40;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                      in_stack_fffffffffffffc58);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"hidden_dim",(char *)ptVar5);
  boost::program_options::value<unsigned_int>();
  local_f0 = 0x32;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                      in_stack_fffffffffffffc58);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"pretrained_dim",(char *)ptVar5);
  boost::program_options::value<unsigned_int>();
  local_f4 = 0x3c;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                      in_stack_fffffffffffffc58);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"lstm_input_dim",(char *)ptVar5);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"train,t");
  ptVar1 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"words,w",(char *)ptVar1);
  boost::program_options::value<unsigned_int>();
  local_f8 = 1;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     ((typed_value<unsigned_int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                      in_stack_fffffffffffffc58);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"beam_size,b",(char *)ptVar5);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar2,"debug")
  ;
  boost::program_options::options_description_easy_init::operator()(pcVar2,"help,h");
  boost::program_options::options_description::options_description
            (local_178,(uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  boost::program_options::options_description::add(local_178);
  local_1c8 = 0;
  uStack_1c0 = 0;
  uStack_1b8 = 0;
  uStack_1b0 = 0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x4afa38);
  boost::program_options::parse_command_line<char>
            (argc_00,argv_00,(options_description *)ptVar4,style,ext);
  boost::program_options::store(local_1a0,local_18,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x4afa8b);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x4afa98);
  paVar7 = &local_1e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"help",paVar7);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  if (sVar6 != 0) {
    this = (void *)boost::program_options::operator<<((ostream *)&std::cerr,local_178);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  this_00 = (options_description *)(local_18 + 0x10);
  __x = (key_type *)local_211;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_211 + 1),"training_data",(allocator *)__x);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(in_stack_fffffffffffffc40,__x);
  std::__cxx11::string::~string((string *)(local_211 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_211);
  if (sVar6 == 0) {
    std::operator<<((ostream *)&std::cerr,
                    "Please specify --traing_data (-T): this is required to determine the vocabulary mapping, even if the parser is used in prediction mode.\n"
                   );
    exit(1);
  }
  boost::program_options::options_description::~options_description(this_00);
  boost::program_options::options_description::~options_description(this_00);
  return;
}

Assistant:

void InitCommandLine(int argc, char** argv, po::variables_map* conf) {
  po::options_description opts("Configuration options");
  opts.add_options()
        ("training_data,T", po::value<string>(), "List of Transitions - Training corpus")
        ("dev_data,d", po::value<string>(), "Development corpus")
        ("bracketing_dev_data,C", po::value<string>(), "Development bracketed corpus")

        ("test_data,p", po::value<string>(), "Test corpus")
        ("dropout,D", po::value<float>(), "Dropout rate")
        ("samples,s", po::value<unsigned>(), "Sample N trees for each test sentence instead of greedy max decoding")
        ("alpha,a", po::value<float>(), "Flatten (0 < alpha < 1) or sharpen (1 < alpha) sampling distribution")
        ("model,m", po::value<string>(), "Load saved model from this file")
        ("use_pos_tags,P", "make POS tags visible to parser")
        ("layers", po::value<unsigned>()->default_value(2), "number of LSTM layers")
        ("action_dim", po::value<unsigned>()->default_value(16), "action embedding size")
        ("pos_dim", po::value<unsigned>()->default_value(12), "POS dimension")
        ("input_dim", po::value<unsigned>()->default_value(32), "input embedding size")
        ("hidden_dim", po::value<unsigned>()->default_value(64), "hidden dimension")
        ("pretrained_dim", po::value<unsigned>()->default_value(50), "pretrained input dimension")
        ("lstm_input_dim", po::value<unsigned>()->default_value(60), "LSTM input dimension")
        ("train,t", "Should training be run?")
        ("words,w", po::value<string>(), "Pretrained word embeddings")
        ("beam_size,b", po::value<unsigned>()->default_value(1), "beam size")
	("debug","debug")
        ("help,h", "Help");
  po::options_description dcmdline_options;
  dcmdline_options.add(opts);
  po::store(parse_command_line(argc, argv, dcmdline_options), *conf);
  if (conf->count("help")) {
    cerr << dcmdline_options << endl;
    exit(1);
  }
  if (conf->count("training_data") == 0) {
    cerr << "Please specify --traing_data (-T): this is required to determine the vocabulary mapping, even if the parser is used in prediction mode.\n";
    exit(1);
  }
}